

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O2

void __thiscall NeuralNetwork::gradientDescent(NeuralNetwork *this)

{
  float *scalar;
  pointer pLVar1;
  long lVar2;
  int i;
  long lVar3;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
  CStack_58;
  
  scalar = &this->learningRate_;
  lVar2 = 0x48;
  for (lVar3 = 0; lVar3 < (long)this->layerCount_ + -1; lVar3 = lVar3 + 1) {
    pLVar1 = (this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)&CStack_58,
               (MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)((long)&pLVar1->size + lVar2),scalar)
    ;
    Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator-=
              ((MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)((long)pLVar1 + lVar2 + -0x10),
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                *)&CStack_58);
    Eigen::MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator*
              (&CStack_58,
               (MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)((long)pLVar1 + lVar2 + -0x28),
               scalar);
    Eigen::MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator-=
              ((MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)((long)pLVar1 + lVar2 + -0x40),
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
                *)&CStack_58);
    lVar2 = lVar2 + 0x78;
  }
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)&CStack_58,
             (MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)
             &(this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].biasGrads,scalar);
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator-=
            ((MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)
             &(this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].bias,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
              *)&CStack_58);
  return;
}

Assistant:

void NeuralNetwork::gradientDescent() {
    using namespace std;
    //最后一层没有权重
    for (int i = 0; i < layerCount_ - 1; ++i) {
        auto& l = layers_[i];
        l.bias -= l.biasGrads * learningRate_;
        l.weights -= l.weightGrads * learningRate_;
    }
    this->layers_.back().bias -= this->layers_.back().biasGrads * learningRate_;
}